

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict declaration(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  int iVar2;
  node_t_conflict pnVar3;
  node_t_conflict n;
  node_t_conflict pnVar4;
  node_t_conflict pnVar5;
  node_t_conflict op4;
  node_t_conflict op5;
  char *expected_name;
  pos_t pVar6;
  tpname_t local_c0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  char *local_88;
  pos_t last_pos;
  pos_t pos;
  node_t_conflict asm_part;
  node_t_conflict attrs;
  node_t_conflict r;
  node_t_conflict spec;
  node_t_conflict decl;
  node_t_conflict list;
  node_t_conflict op;
  int typedef_p;
  parse_ctx_t parse_ctx;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  pos.lno = 0;
  pos.ln_pos = 0;
  if ((short)*(undefined4 *)ppVar1->curr_token == 0x117) {
    attrs = st_assert(c2m_ctx,no_err_p);
    if (attrs == &err_struct) {
      return attrs;
    }
  }
  else {
    iVar2 = match(c2m_ctx,0x3b,(pos_t *)&last_pos.lno,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar2 == 0) {
      try_attr_spec(c2m_ctx,ppVar1->curr_token->pos,(node_t_conflict *)0x0);
      pnVar3 = declaration_specs(c2m_ctx,no_err_p,
                                 (node_t_conflict)(ulong)(ppVar1->curr_scope == c2m_ctx->top_scope))
      ;
      if (pnVar3 == &err_struct) {
        return &err_struct;
      }
      local_98 = (undefined1  [16])get_node_pos(c2m_ctx,pnVar3);
      local_88 = (char *)local_98._0_8_;
      last_pos.fname = (char *)local_98._8_8_;
      n = new_node(c2m_ctx,N_LIST);
      if ((short)*(undefined4 *)ppVar1->curr_token == 0x3b) {
        pnVar4 = new_node(c2m_ctx,N_IGNORE);
        pnVar5 = new_node(c2m_ctx,N_IGNORE);
        op4 = new_node(c2m_ctx,N_IGNORE);
        op5 = new_node(c2m_ctx,N_IGNORE);
        pnVar3 = new_node5(c2m_ctx,N_SPEC_DECL,pnVar3,pnVar4,pnVar5,op4,op5);
        op_append(c2m_ctx,n,pnVar3);
      }
      else {
        for (list = DLIST_node_t_head(&(pnVar3->u).ops);
            (list != (node_t_conflict)0x0 && (list->code != N_TYPEDEF));
            list = DLIST_node_t_next(list)) {
        }
        do {
          pnVar4 = declarator(c2m_ctx,no_err_p);
          if (pnVar4 == &err_struct) {
            return &err_struct;
          }
          local_a8 = (undefined1  [16])get_node_pos(c2m_ctx,pnVar4);
          local_88 = (char *)local_a8._0_8_;
          last_pos.fname = (char *)local_a8._8_8_;
          if (pnVar4->code != N_DECL) {
            __assert_fail("decl->code == N_DECL",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x1135,"node_t declaration(c2m_ctx_t, int)");
          }
          pnVar5 = DLIST_node_t_head(&(pnVar4->u).ops);
          tpname_add(&local_c0,c2m_ctx,pnVar5,ppVar1->curr_scope,
                     (uint)(list != (node_t_conflict)0x0));
          pVar6._8_8_ = last_pos.fname;
          pVar6.fname = local_88;
          asm_part = try_attr_spec(c2m_ctx,pVar6,(node_t_conflict *)&pos.lno);
          if (asm_part == &err_struct) {
            asm_part = new_node(c2m_ctx,N_IGNORE);
          }
          if (pos._8_8_ == 0) {
            pos._8_8_ = new_node(c2m_ctx,N_IGNORE);
          }
          iVar2 = match(c2m_ctx,0x3d,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
          if (iVar2 == 0) {
            attrs = new_node(c2m_ctx,N_IGNORE);
          }
          else {
            attrs = initializer(c2m_ctx,no_err_p);
            if (attrs == &err_struct) {
              return &err_struct;
            }
          }
          pVar6 = get_node_pos(c2m_ctx,pnVar4);
          pnVar5 = new_node1(c2m_ctx,N_SHARE,pnVar3);
          pnVar4 = new_pos_node5(c2m_ctx,N_SPEC_DECL,pVar6,pnVar5,pnVar4,asm_part,
                                 (node_t_conflict)pos._8_8_,attrs);
          op_append(c2m_ctx,n,pnVar4);
          iVar2 = match(c2m_ctx,0x2c,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        } while (iVar2 != 0);
      }
      iVar2 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      attrs = n;
      if (iVar2 == 0) {
        if (ppVar1->record_level == 0) {
          expected_name = get_token_name(c2m_ctx,0x3b);
          syntax_error(c2m_ctx,expected_name);
        }
        c2m_ctx_local = (c2m_ctx_t)&err_struct;
        return (node_t_conflict)c2m_ctx_local;
      }
    }
    else {
      attrs = new_node(c2m_ctx,N_LIST);
      if ((ppVar1->curr_scope == c2m_ctx->top_scope) && (c2m_ctx->options->pedantic_p != 0)) {
        warning(c2m_ctx,0x1d8082,(char *)last_pos._8_8_,pos.fname);
      }
    }
  }
  return attrs;
}

Assistant:

D (declaration) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  int typedef_p;
  node_t op, list, decl, spec, r, attrs, asm_part = NULL;
  pos_t pos, last_pos;

  if (C (T_STATIC_ASSERT)) {
    P (st_assert);
  } else if (MP (';', pos)) {
    r = new_node (c2m_ctx, N_LIST);
    if (curr_scope == top_scope && c2m_options->pedantic_p)
      warning (c2m_ctx, pos, "extra ; outside of a function");
  } else {
    try_attr_spec (c2m_ctx, curr_token->pos, NULL);
    PA (declaration_specs, curr_scope == top_scope ? (node_t) 1 : NULL);
    spec = r;
    last_pos = POS (spec);
    list = new_node (c2m_ctx, N_LIST);
    if (C (';')) {
      op_append (c2m_ctx, list,
                 new_node5 (c2m_ctx, N_SPEC_DECL, spec, new_node (c2m_ctx, N_IGNORE),
                            new_node (c2m_ctx, N_IGNORE), new_node (c2m_ctx, N_IGNORE),
                            new_node (c2m_ctx, N_IGNORE)));
    } else { /* init-declarator-list */
      for (op = NL_HEAD (spec->u.ops); op != NULL; op = NL_NEXT (op))
        if (op->code == N_TYPEDEF) break;
      typedef_p = op != NULL;
      for (;;) { /* init-declarator */
        P (declarator);
        decl = r;
        last_pos = POS (decl);
        assert (decl->code == N_DECL);
        op = NL_HEAD (decl->u.ops);
        tpname_add (c2m_ctx, op, curr_scope, typedef_p);
        attrs = try_attr_spec (c2m_ctx, last_pos, &asm_part);
        if (attrs == err_node) attrs = new_node (c2m_ctx, N_IGNORE);
        if (asm_part == NULL) asm_part = new_node (c2m_ctx, N_IGNORE);
        if (M ('=')) {
          P (initializer);
        } else {
          r = new_node (c2m_ctx, N_IGNORE);
        }
        op_append (c2m_ctx, list,
                   new_pos_node5 (c2m_ctx, N_SPEC_DECL, POS (decl),
                                  new_node1 (c2m_ctx, N_SHARE, spec), decl, attrs, asm_part, r));
        if (!M (',')) break;
      }
    }
    r = list;
    PT (';');
  }
  return r;
}